

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
::emplace_back<int,int>
          (SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
           *this,int *args,int *args_1)

{
  EVP_PKEY_CTX *pEVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  reference ppVar5;
  reference extraout_RAX;
  EVP_PKEY_CTX *pEVar6;
  uint uVar7;
  EVP_PKEY_CTX *ctx;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  undefined1 *puVar11;
  long lVar12;
  ulong uVar13;
  
  uVar2 = *(ulong *)(this + 8);
  uVar3 = *(ulong *)(this + 0x10);
  lVar12 = uVar2 * 0x10;
  pEVar6 = (EVP_PKEY_CTX *)(*(long *)this + lVar12);
  if (uVar2 == uVar3) {
    if (uVar2 == 0x7ffffffffffffff) {
      detail::throwLengthError();
    }
    uVar13 = uVar2 + 1;
    if (uVar2 + 1 < uVar3 * 2) {
      uVar13 = uVar3 * 2;
    }
    if (0x7ffffffffffffff - uVar3 < uVar3) {
      uVar13 = 0x7ffffffffffffff;
    }
    puVar4 = (undefined1 *)operator_new(uVar13 << 4);
    iVar8 = *args;
    puVar4[lVar12] = 1;
    *(int *)(puVar4 + lVar12 + 4) = iVar8;
    iVar8 = *args_1;
    puVar4[lVar12 + 8] = 1;
    *(int *)(puVar4 + lVar12 + 0xc) = iVar8;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    ctx = *(EVP_PKEY_CTX **)this;
    lVar9 = *(long *)(this + 8) * 0x10;
    pEVar1 = ctx + lVar9;
    if (pEVar1 == pEVar6) {
      if (*(long *)(this + 8) != 0) {
        iVar8 = 0;
        lVar12 = 0;
        do {
          puVar4[lVar12] = 1;
          *(undefined4 *)(puVar4 + lVar12 + 4) = *(undefined4 *)(ctx + lVar12 + 4);
          *(undefined4 *)(ctx + lVar12 + 4) = 0;
          puVar4[lVar12 + 8] = 1;
          *(undefined4 *)(puVar4 + lVar12 + 0xc) = *(undefined4 *)(ctx + lVar12 + 0xc);
          *(undefined4 *)(ctx + lVar12 + 0xc) = 0;
          lVar12 = lVar12 + 0x10;
          iVar8 = iVar8 + -2;
        } while (lVar9 != lVar12);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
    }
    else {
      if (ctx != pEVar6) {
        iVar8 = 0;
        puVar11 = puVar4;
        do {
          *puVar11 = 1;
          *(undefined4 *)(puVar11 + 4) = *(undefined4 *)(ctx + 4);
          *(undefined4 *)(ctx + 4) = 0;
          puVar11[8] = 1;
          *(undefined4 *)(puVar11 + 0xc) = *(undefined4 *)(ctx + 0xc);
          *(undefined4 *)(ctx + 0xc) = 0;
          ctx = ctx + 0x10;
          puVar11 = puVar11 + 0x10;
          iVar8 = iVar8 + -2;
        } while (ctx != pEVar6);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
      puVar10 = (undefined4 *)(puVar4 + lVar12 + 0x1c);
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        *(undefined1 *)(puVar10 + -3) = 1;
        puVar10[-2] = *(undefined4 *)(pEVar6 + 4);
        *(undefined4 *)(pEVar6 + 4) = 0;
        *(undefined1 *)(puVar10 + -1) = 1;
        *puVar10 = *(undefined4 *)(pEVar6 + 0xc);
        *(undefined4 *)(pEVar6 + 0xc) = 0;
        pEVar6 = pEVar6 + 0x10;
        puVar10 = puVar10 + 4;
        uVar7 = (int)ctx - 2;
        ctx = (EVP_PKEY_CTX *)(ulong)uVar7;
      } while (pEVar6 != pEVar1);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar7;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar7;
    }
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
    ::cleanup((SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
               *)this,ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar13;
    *(undefined1 **)this = puVar4;
    ppVar5 = extraout_RAX;
  }
  else {
    iVar8 = *args;
    *pEVar6 = (EVP_PKEY_CTX)0x1;
    *(int *)(pEVar6 + 4) = iVar8;
    iVar8 = *args_1;
    pEVar6[8] = (EVP_PKEY_CTX)0x1;
    *(int *)(pEVar6 + 0xc) = iVar8;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    ppVar5 = (reference)(ulong)(anonymous_namespace)::Constructable::numConstructorCalls;
    *(ulong *)(this + 8) = uVar2 + 1;
  }
  return ppVar5;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }